

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdD3D56TlvUv::adjust_orig_mthd(MthdD3D56TlvUv *this)

{
  MthdD3D56TlvUv *this_local;
  
  if ((this->fin & 1U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.notify =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.notify & 0xfffffffe;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) && ((this->fin & 1U) != 0)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] = 0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] = 0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (fin)
			insrt(orig.notify, 0, 1, 0);
		if (cls == 0x48 && fin) {
			// XXX: test me
			exp.valid[0] = 0;
			exp.valid[1] = 0;
			skip = true;
		}
	}